

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CaseStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CaseStatement,slang::ast::CaseStatementCondition&,slang::ast::CaseStatementCheck&,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::CaseStatement::ItemGroup,18446744073709551615ul>,slang::ast::Statement_const*&,slang::SourceRange>
          (BumpAllocator *this,CaseStatementCondition *args,CaseStatementCheck *args_1,
          Expression *args_2,
          span<slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *args_3,
          Statement **args_4,SourceRange *args_5)

{
  CaseStatementCondition CVar1;
  CaseStatementCheck CVar2;
  Statement *pSVar3;
  pointer pIVar4;
  size_type sVar5;
  SourceLocation SVar6;
  SourceLocation SVar7;
  CaseStatement *pCVar8;
  
  pCVar8 = (CaseStatement *)allocate(this,0x48,8);
  CVar1 = *args;
  CVar2 = *args_1;
  pIVar4 = args_3->data_;
  sVar5 = args_3->size_;
  pSVar3 = *args_4;
  SVar6 = args_5->startLoc;
  SVar7 = args_5->endLoc;
  (pCVar8->super_Statement).kind = Case;
  (pCVar8->super_Statement).syntax = (StatementSyntax *)0x0;
  (pCVar8->super_Statement).sourceRange.startLoc = SVar6;
  (pCVar8->super_Statement).sourceRange.endLoc = SVar7;
  pCVar8->expr = args_2;
  (pCVar8->items).data_ = pIVar4;
  (pCVar8->items).size_ = sVar5;
  pCVar8->defaultCase = pSVar3;
  pCVar8->condition = CVar1;
  pCVar8->check = CVar2;
  return pCVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }